

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O0

int luaB_opentests(lua_State *L)

{
  void *L_00;
  lua_Alloc p_Var1;
  Memcontrol *local_18;
  void *ud;
  lua_State *L_local;
  
  ud = L;
  lua_atpanic(L,tpanic);
  atexit(checkfinalmem);
  p_Var1 = lua_getallocf((lua_State *)ud,&local_18);
  L_00 = ud;
  if (p_Var1 != debug_realloc) {
    __assert_fail("lua_getallocf(L, &ud) == debug_realloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x6c4,"int luaB_opentests(lua_State *)");
  }
  if (local_18 == &l_memcontrol) {
    p_Var1 = lua_getallocf((lua_State *)ud,(void **)0x0);
    lua_setallocf((lua_State *)L_00,p_Var1,local_18);
    luaL_checkversion_((lua_State *)ud,503.0,0x88);
    lua_createtable((lua_State *)ud,0,0x25);
    luaL_setfuncs((lua_State *)ud,tests_funcs,0);
    return 1;
  }
  __assert_fail("ud == ((void *)(&l_memcontrol))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x6c6,"int luaB_opentests(lua_State *)");
}

Assistant:

int luaB_opentests (lua_State *L) {
  void *ud;
  lua_atpanic(L, &tpanic);
  atexit(checkfinalmem);
#if _WIN32
  lua_getallocf(L, &ud);
#else
  lua_assert(lua_getallocf(L, &ud) == debug_realloc);
#endif
  lua_assert(ud == cast(void *, &l_memcontrol));
  lua_setallocf(L, lua_getallocf(L, NULL), ud);
  luaL_newlib(L, tests_funcs);
  return 1;
}